

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setAccessibleDescription(QWidget *this,QString *description)

{
  bool bVar1;
  QWidgetPrivate *lhs;
  QString *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QAccessibleEvent event;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QWidget *)0x3802be);
  bVar1 = ::operator==((QString *)lhs,(QString *)in_RDI);
  if (!bVar1) {
    QString::operator=(&lhs->accessibleDescription,in_RSI);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_28,in_RDI,DescriptionChanged);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setAccessibleDescription(const QString &description)
{
    Q_D(QWidget);
    if (d->accessibleDescription == description)
        return;

    d->accessibleDescription = description;
    QAccessibleEvent event(this, QAccessible::DescriptionChanged);
    QAccessible::updateAccessibility(&event);
}